

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O1

void boost::detail::test_eq_impl<unsigned_long,unsigned_long>
               (char *expr1,char *expr2,char *file,int line,char *function,unsigned_long *t,
               unsigned_long *u)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  
  if (*t == *u) {
    if (report_errors_remind()::r == '\0') {
      test_eq_impl<unsigned_long,unsigned_long>();
    }
  }
  else {
    if (file == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c080);
    }
    else {
      sVar2 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,file,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): test \'",9);
    iVar1 = (int)poVar3;
    if (expr1 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen(expr1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,expr1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," == ",4);
    if (expr2 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen(expr2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,expr2,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' failed in function \'",0x16);
    if (function == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen(function);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,function,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\': ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' != \'",6);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (report_errors_remind()::r == '\0') {
      test_eq_impl<unsigned_long,unsigned_long>();
    }
    test_errors()::x = test_errors()::x + 1;
  }
  return;
}

Assistant:

inline void test_eq_impl( char const * expr1, char const * expr2,
  char const * file, int line, char const * function, T const & t, U const & u )
{
    if( t == u )
    {
        report_errors_remind();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << t << "' != '" << u << "'" << std::endl;
        ++test_errors();
    }
}